

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.cpp
# Opt level: O2

void __thiscall chatra::Reader::add(Reader *this,MethodTable *methodTable)

{
  _Fwd_list_impl _Var1;
  Node *local_28;
  MethodTable *local_20;
  MethodTable *methodTable_local;
  
  local_20 = methodTable;
  if (methodTable->source == InnerFunctions) {
    local_28 = methodTable->sourceNodePtr;
    std::
    _Hashtable<chatra::Node*,std::pair<chatra::Node*const,chatra::MethodTable_const*>,std::allocator<std::pair<chatra::Node*const,chatra::MethodTable_const*>>,std::__detail::_Select1st,std::equal_to<chatra::Node*>,std::hash<chatra::Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<chatra::Node*,chatra::MethodTable_const*&>
              ((_Hashtable<chatra::Node*,std::pair<chatra::Node*const,chatra::MethodTable_const*>,std::allocator<std::pair<chatra::Node*const,chatra::MethodTable_const*>>,std::__detail::_Select1st,std::equal_to<chatra::Node*>,std::hash<chatra::Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->nodeMethodTableMap,&local_28,&local_20);
  }
  _Var1._M_head._M_next = (_Fwd_list_node_base)&local_20->methods;
  while (_Var1._M_head._M_next = *(_Fwd_list_node_base *)_Var1._M_head._M_next,
        (_Fwd_list_impl)_Var1._M_head._M_next != (_Fwd_list_impl)0x0) {
    add(this,(Method *)((long)_Var1._M_head._M_next + 8));
  }
  return;
}

Assistant:

void Reader::add(const MethodTable* methodTable) {
	if (methodTable->getSource() == MethodTable::Source::InnerFunctions)
		nodeMethodTableMap.emplace(methodTable->sourceNode(), methodTable);
	methodTable->forEach([&](const Method& method) {
		add(&method);
	});
}